

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varchar_data.hpp
# Opt level: O2

void duckdb::ArrowVarcharData<duckdb::string_t,_duckdb::ArrowVarcharConverter,_int>::
     AppendTemplated<false>
               (ArrowAppendData *append_data,Vector *input,idx_t from,idx_t to,idx_t input_size)

{
  data_ptr_t pdVar1;
  idx_t iVar2;
  ArrowBuffer *this;
  ArrowBuffer *buffer;
  ArrowBuffer *this_00;
  ulong uVar3;
  InvalidInputException *this_01;
  void *__src;
  ArrowAppendData *pAVar4;
  long lVar5;
  int iVar6;
  ulong params_1;
  ulong uVar7;
  long lVar8;
  allocator local_d1;
  ArrowAppendData *local_d0;
  idx_t local_c8;
  data_ptr_t local_c0;
  long local_b8;
  data_ptr_t local_b0;
  ArrowBuffer *local_a8;
  long local_a0;
  string local_98;
  UnifiedVectorFormat format;
  
  local_c8 = to;
  UnifiedVectorFormat::UnifiedVectorFormat(&format);
  Vector::ToUnifiedFormat(input,input_size,&format);
  this = ArrowAppendData::GetMainBuffer(append_data);
  buffer = ArrowAppendData::GetValidityBuffer(append_data);
  this_00 = ArrowAppendData::GetAuxBuffer(append_data);
  lVar8 = local_c8 - from;
  ResizeValidity(buffer,append_data->row_count + lVar8);
  local_b0 = buffer->dataptr;
  local_d0 = append_data;
  ArrowBuffer::resize(this,this->count + lVar8 * 4 + 4);
  local_c0 = format.data;
  pdVar1 = this->dataptr;
  iVar2 = local_d0->row_count;
  if (iVar2 == 0) {
    pdVar1[0] = '\0';
    pdVar1[1] = '\0';
    pdVar1[2] = '\0';
    pdVar1[3] = '\0';
  }
  params_1 = (ulong)*(uint *)(pdVar1 + iVar2 * 4);
  lVar5 = 0;
  pAVar4 = local_d0;
  local_b8 = lVar8;
  local_a8 = this_00;
  do {
    if (local_c8 <= from) {
      pAVar4->row_count = pAVar4->row_count + local_b8;
      UnifiedVectorFormat::~UnifiedVectorFormat(&format);
      return;
    }
    uVar7 = from;
    if ((format.sel)->sel_vector != (sel_t *)0x0) {
      uVar7 = (ulong)(format.sel)->sel_vector[from];
    }
    uVar3 = pAVar4->row_count + lVar5;
    iVar6 = (int)params_1;
    if ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
         (unsigned_long *)0x0) ||
       ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar7 >> 6] >>
         (uVar7 & 0x3f) & 1) != 0)) {
      params_1 = (ulong)*(uint *)(local_c0 + uVar7 * 0x10) + (long)iVar6;
      local_a0 = lVar5;
      if ((params_1 & 0xffffffff80000000) != 0) {
        this_01 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_98,
                   "Arrow Appender: The maximum total string size for regular string buffers is %u but the offset of %lu exceeds this.\n* SET arrow_large_buffer_size=true to use large string buffers"
                   ,&local_d1);
        InvalidInputException::InvalidInputException<int,unsigned_long>
                  (this_01,&local_98,0x7fffffff,params_1);
        __cxa_throw(this_01,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      *(int *)(pdVar1 + (uVar3 + 1) * 4) = (int)params_1;
      ArrowBuffer::resize(this_00,params_1);
      local_98._M_dataplus._M_p = *(pointer *)(local_c0 + uVar7 * 0x10);
      local_98._M_string_length = *(ulong *)((long)(local_c0 + uVar7 * 0x10) + 8);
      __src = (void *)local_98._M_string_length;
      if ((uint)local_98._M_dataplus._M_p < 0xd) {
        __src = (void *)((long)&local_98._M_dataplus._M_p + 4);
      }
      switchD_01939fa4::default
                (this_00->dataptr + iVar6,__src,(ulong)local_98._M_dataplus._M_p & 0xffffffff);
      pAVar4 = local_d0;
      lVar5 = local_a0;
    }
    else {
      local_b0[uVar3 >> 3] = local_b0[uVar3 >> 3] & ~(byte)(1L << ((byte)uVar3 & 7));
      pAVar4->null_count = pAVar4->null_count + 1;
      *(int *)(pdVar1 + (uVar3 + 1) * 4) = iVar6;
    }
    from = from + 1;
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

static void AppendTemplated(ArrowAppendData &append_data, Vector &input, idx_t from, idx_t to, idx_t input_size) {
		idx_t size = to - from;
		UnifiedVectorFormat format;
		input.ToUnifiedFormat(input_size, format);
		auto &main_buffer = append_data.GetMainBuffer();
		auto &validity_buffer = append_data.GetValidityBuffer();
		auto &aux_buffer = append_data.GetAuxBuffer();

		// resize the validity mask and set up the validity buffer for iteration
		ResizeValidity(validity_buffer, append_data.row_count + size);
		auto validity_data = (uint8_t *)validity_buffer.data();

		// resize the offset buffer - the offset buffer holds the offsets into the child array
		main_buffer.resize(main_buffer.size() + sizeof(BUFTYPE) * (size + 1));
		auto data = UnifiedVectorFormat::GetData<SRC>(format);
		auto offset_data = main_buffer.GetData<BUFTYPE>();
		if (append_data.row_count == 0) {
			// first entry
			offset_data[0] = 0;
		}
		// now append the string data to the auxiliary buffer
		// the auxiliary buffer's length depends on the string lengths, so we resize as required
		auto last_offset = offset_data[append_data.row_count];
		for (idx_t i = from; i < to; i++) {
			auto source_idx = format.sel->get_index(i);
			auto offset_idx = append_data.row_count + i + 1 - from;

			if (!format.validity.RowIsValid(source_idx)) {
				uint8_t current_bit;
				idx_t current_byte;
				GetBitPosition(append_data.row_count + i - from, current_byte, current_bit);
				SetNull(append_data, validity_data, current_byte, current_bit);
				offset_data[offset_idx] = last_offset;
				continue;
			}

			auto string_length = OP::GetLength(data[source_idx]);

			// append the offset data
			auto current_offset = UnsafeNumericCast<idx_t>(last_offset) + string_length;
			if (!LARGE_STRING &&
			    UnsafeNumericCast<idx_t>(last_offset) + string_length > NumericLimits<int32_t>::Maximum()) {
				D_ASSERT(append_data.options.arrow_offset_size == ArrowOffsetSize::REGULAR);
				throw InvalidInputException(
				    "Arrow Appender: The maximum total string size for regular string buffers is "
				    "%u but the offset of %lu exceeds this.\n* SET arrow_large_buffer_size=true to use large string "
				    "buffers",
				    NumericLimits<int32_t>::Maximum(), current_offset);
			}
			offset_data[offset_idx] = UnsafeNumericCast<BUFTYPE>(current_offset);

			// resize the string buffer if required, and write the string data
			aux_buffer.resize(current_offset);
			OP::WriteData(aux_buffer.data() + last_offset, data[source_idx]);

			last_offset = UnsafeNumericCast<BUFTYPE>(current_offset);
		}
		append_data.row_count += size;
	}